

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::pinField(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int value;
  int value_00;
  int32_t min;
  int32_t max;
  UErrorCode *status_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  value = (*(this->super_UObject)._vptr_UObject[0x16])(this,(ulong)field,status);
  value_00 = (*(this->super_UObject)._vptr_UObject[0x15])(this,(ulong)field,status);
  if (value < this->fFields[field]) {
    set(this,field,value);
  }
  else if (this->fFields[field] < value_00) {
    set(this,field,value_00);
  }
  return;
}

Assistant:

void Calendar::pinField(UCalendarDateFields field, UErrorCode& status) {
    int32_t max = getActualMaximum(field, status);
    int32_t min = getActualMinimum(field, status);

    if (fFields[field] > max) {
        set(field, max);
    } else if (fFields[field] < min) {
        set(field, min);
    }
}